

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

void membuf_delete(membuf **sbp)

{
  membuf *sb;
  
  sb = *sbp;
  membuf_free(sb);
  free(sb);
  *sbp = (membuf *)0x0;
  return;
}

Assistant:

void membuf_delete(struct membuf **sbp)
{
    struct membuf *sb;

    sb = *sbp;
    membuf_free(sb);
    free(sb);
    sb = NULL;
    *sbp = sb;
}